

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O1

bool __thiscall
sig::
Signal_impl<void_(int),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(int)>,_std::mutex>
::enabled(Signal_impl<void_(int),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(int)>,_std::mutex>
          *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx_);
  if (iVar2 == 0) {
    bVar1 = this->enabled_;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
    return bVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool enabled() const {
        std::lock_guard<Mutex> lock{mtx_};
        return enabled_;
    }